

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O0

int Saig_ManCexVerifyUsingTernary(Aig_Man_t *pAig,Abc_Cex_t *pCex,Abc_Cex_t *pCare)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int local_44;
  int local_40;
  int iBit;
  int f;
  int i;
  Aig_Obj_t *pObjRo;
  Aig_Obj_t *pObjRi;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pCare_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  if (pCex->iFrame != pCare->iFrame) {
    __assert_fail("pCex->iFrame == pCare->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x28b,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  if (pCex->nBits != pCare->nBits) {
    __assert_fail("pCex->nBits == pCare->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x28c,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  iVar2 = pCex->iPo;
  iVar1 = Saig_ManPoNum(pAig);
  if (iVar1 <= iVar2) {
    __assert_fail("pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x28d,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  pAVar3 = Aig_ManConst1(pAig);
  Saig_ObjCexMinSet1(pAVar3);
  iBit = 0;
  while( true ) {
    iVar2 = Saig_ManRegNum(pAig);
    if (iVar2 <= iBit) {
      local_44 = pCex->nRegs;
      for (local_40 = 0; local_40 <= pCex->iFrame; local_40 = local_40 + 1) {
        for (iBit = 0; iVar2 = Saig_ManPiNum(pAig), iBit < iVar2; iBit = iBit + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,iBit);
          iVar2 = Abc_InfoHasBit((uint *)(pCare + 1),local_44);
          if (iVar2 == 0) {
            Saig_ObjCexMinSetX(pAVar3);
          }
          else {
            iVar2 = Abc_InfoHasBit((uint *)(pCex + 1),local_44);
            if (iVar2 == 0) {
              Saig_ObjCexMinSet0(pAVar3);
            }
            else {
              Saig_ObjCexMinSet1(pAVar3);
            }
          }
          local_44 = local_44 + 1;
        }
        for (iBit = 0; iVar2 = Vec_PtrSize(pAig->vObjs), iBit < iVar2; iBit = iBit + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iBit);
          if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar3), iVar2 != 0)) {
            Saig_ObjCexMinSim(pAVar3);
          }
        }
        for (iBit = 0; iVar2 = Vec_PtrSize(pAig->vCos), iBit < iVar2; iBit = iBit + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iBit);
          Saig_ObjCexMinSim(pAVar3);
        }
        for (iBit = 0; iVar2 = Saig_ManRegNum(pAig), iBit < iVar2; iBit = iBit + 1) {
          pAVar3 = Saig_ManLi(pAig,iBit);
          pAVar4 = Saig_ManLo(pAig,iBit);
          *(ulong *)&pAVar4->field_0x18 =
               *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef |
               (ulong)((uint)(*(ulong *)&pAVar3->field_0x18 >> 4) & 1) << 4;
          *(ulong *)&pAVar4->field_0x18 =
               *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffdf |
               (ulong)((uint)(*(ulong *)&pAVar3->field_0x18 >> 5) & 1) << 5;
        }
      }
      if (local_44 == pCex->nBits) {
        pAVar3 = Aig_ManCo(pAig,pCex->iPo);
        iVar2 = Saig_ObjCexMinGet1(pAVar3);
        return iVar2;
      }
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                    ,0x2bd,
                    "int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
    }
    p = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,iBit + iVar2);
    iVar2 = Abc_InfoHasBit((uint *)(pCex + 1),0);
    if (iVar2 != 0) {
      __assert_fail("!Abc_InfoHasBit(pCex->pData, iBit)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                    ,0x292,
                    "int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
    }
    iVar2 = Abc_InfoHasBit((uint *)(pCare + 1),0);
    if (iVar2 != 0) break;
    Saig_ObjCexMinSet0(pAVar3);
    iBit = iBit + 1;
  }
  __assert_fail("!Abc_InfoHasBit(pCare->pData, iBit)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                ,0x293,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
}

Assistant:

int Saig_ManCexVerifyUsingTernary( Aig_Man_t * pAig, Abc_Cex_t * pCex, Abc_Cex_t * pCare )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, f, iBit = 0;
    assert( pCex->iFrame == pCare->iFrame );
    assert( pCex->nBits  == pCare->nBits );
    assert( pCex->iPo < Saig_ManPoNum(pAig) );
    Saig_ObjCexMinSet1( Aig_ManConst1(pAig) );
    // set flops to the init state
    Saig_ManForEachLo( pAig, pObj, i )
    {
        assert( !Abc_InfoHasBit(pCex->pData, iBit) );
        assert( !Abc_InfoHasBit(pCare->pData, iBit) );
//        if ( Abc_InfoHasBit(pCare->pData, iBit++) )
            Saig_ObjCexMinSet0( pObj );
//        else
//            Saig_ObjCexMinSetX( pObj );
    }
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // init inputs
        Saig_ManForEachPi( pAig, pObj, i )
        {
            if ( Abc_InfoHasBit(pCare->pData, iBit++) )
            {
                if ( Abc_InfoHasBit(pCex->pData, iBit-1) )
                    Saig_ObjCexMinSet1( pObj );
                else
                    Saig_ObjCexMinSet0( pObj );
            }
            else
                Saig_ObjCexMinSetX( pObj );
        }
        // simulate internal nodes
        Aig_ManForEachNode( pAig, pObj, i )
            Saig_ObjCexMinSim( pObj );
        // simulate COs
        Aig_ManForEachCo( pAig, pObj, i )
            Saig_ObjCexMinSim( pObj );
/*
        Aig_ManForEachObj( pAig, pObj, i )
        {
            Aig_ObjPrint(pAig, pObj);
            printf( "  Value = " );
            Saig_ObjCexMinPrint( pObj );
            printf( "\n" );
        }
*/
        // transfer
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, i )
            pObjRo->fMarkA = pObjRi->fMarkA,
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == pCex->nBits );
    return Saig_ObjCexMinGet1( Aig_ManCo( pAig, pCex->iPo ) );
}